

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

DISPOSITION_HANDLE disposition_clone(DISPOSITION_HANDLE value)

{
  AMQP_VALUE pAVar1;
  DISPOSITION_HANDLE local_18;
  DISPOSITION_INSTANCE *disposition_instance;
  DISPOSITION_HANDLE value_local;
  
  local_18 = (DISPOSITION_HANDLE)malloc(8);
  if (local_18 != (DISPOSITION_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    local_18->composite_value = pAVar1;
    if (local_18->composite_value == (AMQP_VALUE)0x0) {
      free(local_18);
      local_18 = (DISPOSITION_HANDLE)0x0;
    }
  }
  return local_18;
}

Assistant:

DISPOSITION_HANDLE disposition_clone(DISPOSITION_HANDLE value)
{
    DISPOSITION_INSTANCE* disposition_instance = (DISPOSITION_INSTANCE*)malloc(sizeof(DISPOSITION_INSTANCE));
    if (disposition_instance != NULL)
    {
        disposition_instance->composite_value = amqpvalue_clone(((DISPOSITION_INSTANCE*)value)->composite_value);
        if (disposition_instance->composite_value == NULL)
        {
            free(disposition_instance);
            disposition_instance = NULL;
        }
    }

    return disposition_instance;
}